

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalCast.h
# Opt level: O3

enable_if_t<std::is_arithmetic<unsigned_long>::value,_bool> __thiscall
beast::detail::LexicalCast<std::__cxx11::string,unsigned_long>::operator()
          (void *this,string *out,unsigned_long in)

{
  bool bVar1;
  char cVar2;
  unsigned_long uVar3;
  char cVar4;
  string __str;
  long *local_40;
  uint local_38;
  long local_30 [2];
  
  cVar4 = '\x01';
  if (9 < in) {
    uVar3 = in;
    cVar2 = '\x04';
    do {
      cVar4 = cVar2;
      if (uVar3 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_0020b7f1;
      }
      if (uVar3 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_0020b7f1;
      }
      if (uVar3 < 10000) goto LAB_0020b7f1;
      bVar1 = 99999 < uVar3;
      uVar3 = uVar3 / 10000;
      cVar2 = cVar4 + '\x04';
    } while (bVar1);
    cVar4 = cVar4 + '\x01';
  }
LAB_0020b7f1:
  local_40 = local_30;
  std::__cxx11::string::_M_construct((ulong)&local_40,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_40,local_38,in);
  std::__cxx11::string::operator=((string *)out,(string *)&local_40);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return true;
}

Assistant:

std::enable_if_t <std::is_arithmetic <Arithmetic>::value, bool>
    operator () (std::string& out, Arithmetic in)
    {
        out = std::to_string (in);
        return true;
    }